

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O0

word_type bv::internal::packed_view<std::vector>::compute_field_mask(size_t width)

{
  undefined1 auVar1 [16];
  size_t i;
  word_type mask;
  size_t fields_per_word;
  size_t width_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = width;
  mask = 0;
  for (i = 0; i < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar1,0); i = i + 1) {
    mask = mask << ((byte)width & 0x3f) | 1;
  }
  return mask;
}

Assistant:

typename packed_view<C>::word_type
        packed_view<C>::compute_field_mask(size_t width)
        {
            size_t fields_per_word = W / width;
            word_type mask = 0;
            
            for(size_t i = 0; i < fields_per_word; ++i)
            {
                mask = mask << width;
                mask = mask | 1;
            }
            
            return mask;
        }